

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

void __thiscall
google::protobuf::io::ConcatenatingInputStream::BackUp(ConcatenatingInputStream *this,int count)

{
  undefined4 in_ESI;
  LogMessage *in_RDI;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  LogMessage *this_00;
  undefined8 in_stack_ffffffffffffff98;
  LogMessage local_48;
  
  if (in_RDI->line_ < 1) {
    this_00 = &local_48;
    internal::LogMessage::LogMessage
              (in_RDI,(LogLevel)((ulong)in_stack_ffffffffffffff98 >> 0x20),(char *)this_00,
               in_stack_ffffffffffffff8c);
    internal::LogMessage::operator<<
              (this_00,(char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    internal::LogFinisher::operator=
              ((LogFinisher *)this_00,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    internal::LogMessage::~LogMessage((LogMessage *)0x44a6c8);
  }
  else {
    (**(code **)(**(long **)in_RDI->filename_ + 0x18))(*(long **)in_RDI->filename_,in_ESI);
  }
  return;
}

Assistant:

void ConcatenatingInputStream::BackUp(int count) {
  if (stream_count_ > 0) {
    streams_[0]->BackUp(count);
  } else {
    GOOGLE_LOG(DFATAL) << "Can't BackUp() after failed Next().";
  }
}